

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readRgba2.cpp
# Opt level: O1

void readRgba2(char *fileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  RgbaInputFile file;
  Rgba local_70 [8];
  
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_70,fileName,iVar3);
  piVar4 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar3 = *piVar4;
  iVar1 = piVar4[1];
  lVar6 = (long)iVar1;
  iVar2 = piVar4[3];
  lVar8 = (long)piVar4[2] - (long)iVar3;
  lVar9 = lVar8 + 1;
  pvVar5 = operator_new__(-(ulong)((ulong)((lVar8 * 2 + 2) * 5) >> 0x3d != 0) | lVar9 * 0x50);
  if (iVar1 <= iVar2) {
    lVar8 = (long)(int)lVar9;
    uVar7 = (long)pvVar5 - ((long)iVar3 * 8 + lVar6 * lVar8 * 8);
    do {
      Imf_3_4::RgbaInputFile::setFrameBuffer(local_70,uVar7,1);
      Imf_3_4::RgbaInputFile::readPixels((int)local_70,(int)lVar6);
      lVar6 = lVar6 + 10;
      uVar7 = uVar7 + lVar8 * -0x50;
    } while (lVar6 <= iVar2);
  }
  operator_delete__(pvVar5);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_70);
  return;
}

Assistant:

void
readRgba2 (const char fileName[])
{
    RgbaInputFile file (fileName);
    Box2i         dw = file.dataWindow ();

    int           width  = dw.max.x - dw.min.x + 1;
    Array2D<Rgba> pixels (10, width);

    while (dw.min.y <= dw.max.y)
    {
        file.setFrameBuffer (
            &pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);

        file.readPixels (dw.min.y, min (dw.min.y + 9, dw.max.y));

        // processPixels (pixels)

        dw.min.y += 10;
    }
}